

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

Status __thiscall
flatbuffers::anon_unknown_7::TextCodeGenerator::GenerateCode
          (TextCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  Status SVar1;
  char *__s;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  __s = GenTextFile(parser,path,filename);
  if (__s == (char *)0x0) {
    SVar1 = OK;
  }
  else {
    local_68[0] = local_58;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,__s,__s + sVar2);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x37f774);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&(this->super_CodeGenerator).status_detail,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    SVar1 = ERROR;
  }
  return SVar1;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    auto err = GenTextFile(parser, path, filename);
    if (err) {
      status_detail = " (" + std::string(err) + ")";
      return Status::ERROR;
    }
    return Status::OK;
  }